

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

frame_line<plot::RealCanvas<plot::BrailleCanvas>_*> * __thiscall
plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>::next
          (frame_line<plot::RealCanvas<plot::BrailleCanvas>_*> *__return_storage_ptr__,
          frame_line<plot::RealCanvas<plot::BrailleCanvas>_*> *this)

{
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *frame;
  ptrdiff_t overflow;
  bool bVar1;
  block_iterator<plot::BrailleCanvas,_plot::detail::braille::line_t> line;
  frame_line<plot::RealCanvas<plot::BrailleCanvas>_*> *this_local;
  
  if ((this->overflow_ == 0) &&
     (bVar1 = block_iterator<plot::BrailleCanvas,_plot::detail::braille::line_t>::operator==
                        (&this->line_,&this->end_), !bVar1)) {
    frame = this->frame_;
    overflow = this->overflow_;
    line = std::
           next<plot::detail::block_iterator<plot::BrailleCanvas,plot::detail::braille::line_t>>
                     ((this->line_).line_,1);
    frame_line(__return_storage_ptr__,frame,overflow,(block_iterator)line.line_,
               (block_iterator)(this->end_).line_);
    return __return_storage_ptr__;
  }
  frame_line(__return_storage_ptr__,this->frame_,this->overflow_ + 1,
             (block_iterator)(this->line_).line_,(block_iterator)(this->end_).line_);
  return __return_storage_ptr__;
}

Assistant:

frame_line next() const {
            return (overflow_ || line_ == end_) ? frame_line(frame_, overflow_ + 1, line_, end_)
                                                : frame_line(frame_, overflow_, std::next(line_), end_);
        }